

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O1

void __thiscall
UnifiedRegex::MatchCharNode::AnnotatePass1
          (MatchCharNode *this,Compiler *compiler,bool parentNotInLoop,bool parentAtLeastOnce,
          bool parentNotSpeculative,bool parentNotNegated)

{
  CharSet<char16_t> *this_00;
  ulong uVar1;
  
  (this->super_Node).features = 0x20;
  (this->super_Node).thisConsumes.lower = 1;
  (this->super_Node).thisConsumes.upper = 1;
  uVar1 = 0;
  this_00 = (CharSet<char16_t> *)new<Memory::ArenaAllocator>(0x28,compiler->ctAllocator,0x366bee);
  CharSet<char16_t>::CharSet(this_00);
  (this->super_Node).firstSet = this_00;
  do {
    CharSet<char16_t>::SetRange
              ((this->super_Node).firstSet,compiler->ctAllocator,this->cs[uVar1],this->cs[uVar1]);
    if (2 < uVar1) break;
    uVar1 = uVar1 + 1;
  } while (this->isEquivClass != false);
  *(uint *)&(this->super_Node).field_0xc =
       (*(uint *)&(this->super_Node).field_0xc & 0xffffc3cc) +
       ((uint)parentNotInLoop << 10 | (uint)parentAtLeastOnce << 0xb |
        (uint)parentNotSpeculative << 0xc | (uint)parentNotNegated << 0xd) + 0x31;
  return;
}

Assistant:

void MatchCharNode::AnnotatePass1(Compiler& compiler, bool parentNotInLoop, bool parentAtLeastOnce, bool parentNotSpeculative, bool parentNotNegated)
    {
        features = HasMatchChar;
        thisConsumes.Exact(1);
        firstSet = Anew(compiler.ctAllocator, UnicodeCharSet);
        for (int i = 0; i < (isEquivClass ? CaseInsensitive::EquivClassSize : 1); i++)
            firstSet->Set(compiler.ctAllocator, cs[i]);
        isFirstExact = true;
        isThisIrrefutable = false;
        isThisWillNotProgress = true;
        isThisWillNotRegress = true;
        isNotInLoop = parentNotInLoop;
        isAtLeastOnce = parentAtLeastOnce;
        isNotSpeculative = parentNotSpeculative;
        isNotNegated = parentNotNegated;
    }